

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

bool __thiscall CCheckQueue<CScriptCheck>::Loop(CCheckQueue<CScriptCheck> *this,bool fMaster)

{
  uint *puVar1;
  CScriptCheck *pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  CScriptCheck *pCVar5;
  byte bVar6;
  uint uVar7;
  pointer pCVar8;
  unique_lock *puVar9;
  pointer pCVar10;
  undefined1 uVar11;
  undefined7 in_register_00000031;
  CScriptCheck *check;
  uint uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> local_68;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar9 = (unique_lock *)&this->m_worker_cv;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    puVar9 = (unique_lock *)&this->m_master_cv;
  }
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (CScriptCheck *)0x0;
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (CScriptCheck *)0x0;
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
            (&local_68,(ulong)this->nBatchSize);
  uVar13 = 0;
  bVar6 = 1;
  pCVar5 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar5;
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar13 == 0) {
      this->nTotal = this->nTotal + 1;
    }
    else {
      this->fAllOk = (bool)(this->fAllOk & bVar6);
      puVar1 = &this->nTodo;
      *puVar1 = *puVar1 - (int)uVar13;
      if (*puVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    pCVar8 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar10 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pCVar8 == pCVar10) {
      do {
        if (this->m_request_stop != false) break;
        if ((fMaster) && (this->nTodo == 0)) {
          this->nTotal = this->nTotal + -1;
          uVar11 = this->fAllOk;
          this->fAllOk = true;
          goto LAB_0067882c;
        }
        this->nIdle = this->nIdle + 1;
        std::condition_variable::wait(puVar9);
        this->nIdle = this->nIdle + -1;
        pCVar8 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pCVar10 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      } while (pCVar8 == pCVar10);
    }
    if (this->m_request_stop != false) {
      uVar11 = 0;
LAB_0067882c:
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)uVar11;
    }
    uVar7 = (uint)((int)((ulong)((long)pCVar10 - (long)pCVar8) >> 4) * -0x33333333) /
            (this->nTotal + this->nIdle + 1U);
    uVar12 = this->nBatchSize;
    if (uVar7 < this->nBatchSize) {
      uVar12 = uVar7;
    }
    uVar13 = (ulong)(uVar12 + (uVar12 == 0));
    std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>>
              ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&local_68,pCVar10 + -uVar13,
               pCVar10);
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::_M_erase
              (&this->queue,pCVar10 + -uVar13,
               (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_finish);
    bVar6 = this->fAllOk;
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pCVar8 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar10 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((bVar6 & 1) != 0) {
          bVar6 = CScriptCheck::operator()(pCVar10);
        }
        pCVar4 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pCVar3 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar10 = pCVar10 + 1;
        pCVar2 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar5 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (pCVar10 != pCVar8);
      for (; pCVar4 != pCVar2; pCVar2 = pCVar2 + 1) {
        if (0x1c < (pCVar2->m_tx_out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar2->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
          (pCVar2->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)0x0;
        }
        pCVar5 = pCVar3;
      }
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }